

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall
diy::AMRLink::AMRLink(AMRLink *this,int dim,int level,int refinement,Bounds *core,Bounds *bounds)

{
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_b0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_70;
  
  DynamicPoint<int,_4UL>::one((DynamicPoint<int,_4UL> *)&local_70,(long)dim);
  operator*((DynamicPoint<int,_4UL> *)&local_b0,refinement,(DynamicPoint<int,_4UL> *)&local_70);
  AMRLink(this,dim,level,(Point *)&local_b0,core,bounds);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_b0);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_70);
  return;
}

Assistant:

AMRLink(int dim, int level, int refinement, const Bounds& core, const Bounds& bounds):
                        AMRLink(dim, level, refinement * Point::one(dim), core, bounds)     {}